

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O1

void do_bleed(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  CHAR_DATA *victim;
  bool bVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  short sVar6;
  char *txt;
  int multiplier;
  AFFECT_DATA af;
  char miss3 [4608];
  char miss2 [4608];
  char miss1 [4608];
  char hit3 [4608];
  char hit2 [4608];
  char hit1 [4608];
  
  iVar3 = get_skill(ch,(int)gsn_bleed);
  if (iVar3 == 0) {
    txt = "Huh?\n\r";
LAB_00331ab0:
    send_to_char(txt,ch);
    return;
  }
  victim = ch->fighting;
  if (victim == (CHAR_DATA *)0x0) {
    txt = "You must be in combat to do that!\n\r";
    goto LAB_00331ab0;
  }
  pOVar5 = get_eq_char(ch,0x10);
  if (pOVar5 == (OBJ_DATA *)0x0) {
    txt = "You cannot execute that move barehanded!\n\r";
    goto LAB_00331ab0;
  }
  switch(pOVar5->value[0]) {
  case 1:
    memcpy(hit1,"Rivulets of blood run to the ground as your blade finds $N\'s artery!",0x45);
    memcpy(hit2,"Rivulets of blood run to the ground as $n\'s blade finds your artery!",0x45);
    memcpy(hit3,"Rivulets of blood run to the ground as $n\'s blade finds $N\'s artery!",0x45);
    builtin_strncpy(miss1 + 0x30,"nect.",6);
    builtin_strncpy(miss1,"You slash at $N\'s exposed artery",0x20);
    builtin_strncpy(miss2 + 0x30,"onnect.",8);
    builtin_strncpy(miss2,"$n slashes at your exposed artery but fails to c",0x30);
    builtin_strncpy(miss3 + 0x30,"onnect.",8);
    builtin_strncpy(miss3,"$n slashes at $N\'s exposed artery but fails to c",0x30);
    multiplier = 100;
    break;
  case 2:
    memcpy(hit1,"Blood fountains from $N\'s artery as you make a jagged cut with your dagger!",0x4c)
    ;
    memcpy(hit2,"Blood fountains from your artery as $n makes a jagged cut with $s dagger!",0x4a);
    memcpy(hit3,"Blood fountains from $N\'s artery as $n makes a jagged cut with $s dagger!",0x4a);
    memcpy(miss1,"You lunge forward, attempting to strike $N\'s artery, but are repulsed.",0x47);
    memcpy(miss2,"$n lunges forward, attempting to strike your artery, but is repulsed.",0x46);
    memcpy(miss3,"$n lunges forward, attempting to strike $N\'s artery, but is repulsed.",0x46);
    multiplier = 0x7d;
    sVar6 = 3;
    goto LAB_003318c0;
  case 3:
    memcpy(hit1,
           "You drive your spear deep into $N\'s flesh, blood spilling forth as you withdraw it!",
           0x54);
    memcpy(hit2,"$n drives $s spear deep into your flesh, blood spilling forth as $e withdraws it!",
           0x52);
    memcpy(hit3,"$n drives $s spear deep into $N\'s flesh, blood spilling forth as $e withdraws it!"
           ,0x52);
    memcpy(miss1,"You lunge powerfully forward with your spear, but fail to connect.",0x43);
    memcpy(miss2,"$n lunges powerfully forward towards you with $s spear, but fails to connect.",
           0x4e);
    memcpy(miss3,"$n lunges powerfully forward towards $N with $s spear, but fails to connect.",0x4d
          );
    multiplier = 200;
    sVar6 = 7;
    goto LAB_003318c0;
  default:
    txt = "You cannot perform this attack with your weapon!\n\r";
    goto LAB_00331ab0;
  case 5:
    memcpy(hit1,
           "You slightly twist your axe as it sinks into $N\'s flesh, and a torrent of blood gushes forth!"
           ,0x5e);
    memcpy(hit2,
           "$n slightly twists $s axe as it sinks into your flesh, and a torrent of blood gushes forth!"
           ,0x5c);
    memcpy(hit3,
           "$n slightly twists $s axe as it sinks into $N\'s flesh, and a torrent of blood gushes forth!"
           ,0x5c);
    builtin_strncpy(miss1,"You swing your axe in a wide arc",0x20);
    builtin_strncpy(miss1 + 0x30,"nect with $N.",0xe);
    builtin_strncpy(miss2,"$n swings $s axe in a wide arc but fails to connect with you.",0x3e);
    builtin_strncpy(miss3,"$n swings $s axe in a wide arc but fails to connect with $N.",0x3d);
    multiplier = 0x7d;
  }
  builtin_strncpy(miss1 + 0x20," but fail to con",0x10);
  sVar6 = 4;
LAB_003318c0:
  sVar1 = ch->level;
  iVar4 = number_percent();
  if ((double)iVar3 * 0.65 <= (double)iVar4) {
    act(miss1,ch,(void *)0x0,victim,3);
    act(miss2,ch,(void *)0x0,victim,2);
    act(miss3,ch,(void *)0x0,victim,1);
    damage(ch,victim,0,(int)gsn_bleed,0,true);
  }
  else {
    act(hit1,ch,(void *)0x0,victim,3);
    act(hit2,ch,(void *)0x0,victim,2);
    act(hit3,ch,(void *)0x0,victim,1);
    bVar2 = is_affected(victim,(int)gsn_bleeding);
    if (!bVar2) {
      init_affect(&af);
      af.where = 0;
      af.type = gsn_bleeding;
      af.level = ch->level;
      af.location = 0;
      af.modifier = 0;
      af.aftype = 3;
      af.end_fun = (AFF_FUN *)0x0;
      af.tick_fun = bleeding_tick;
      af.owner = ch;
      af.duration = sVar1 / sVar6;
      new_affect_to_char(victim,&af);
    }
    one_hit_new(ch,victim,(int)gsn_bleed,true,false,0,multiplier,(char *)0x0);
  }
  check_improve(ch,(int)gsn_bleed,(double)iVar4 < (double)iVar3 * 0.65,1);
  WAIT_STATE(ch,0x18);
  return;
}

Assistant:

void do_bleed(CHAR_DATA *ch, char *argument)
{
	char hit1[MSL], hit2[MSL], hit3[MSL], miss1[MSL], miss2[MSL], miss3[MSL];
	int skill, dammod, affect;
	CHAR_DATA *victim;
	OBJ_DATA *weapon;
	AFFECT_DATA af;

	skill = get_skill(ch, gsn_bleed);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	victim = ch->fighting;

	if (victim == nullptr)
	{
		send_to_char("You must be in combat to do that!\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon != nullptr)
	{
		switch (weapon->value[0])
		{
			case WEAPON_DAGGER:
				sprintf(hit1, "Blood fountains from $N's artery as you make a jagged cut with your dagger!");
				sprintf(hit2, "Blood fountains from your artery as $n makes a jagged cut with $s dagger!");
				sprintf(hit3, "Blood fountains from $N's artery as $n makes a jagged cut with $s dagger!");
				sprintf(miss1, "You lunge forward, attempting to strike $N's artery, but are repulsed.");
				sprintf(miss2, "$n lunges forward, attempting to strike your artery, but is repulsed.");
				sprintf(miss3, "$n lunges forward, attempting to strike $N's artery, but is repulsed.");

				dammod = 125;
				affect = ch->level / 3;
				break;
			case WEAPON_SWORD:
				sprintf(hit1, "Rivulets of blood run to the ground as your blade finds $N's artery!");
				sprintf(hit2, "Rivulets of blood run to the ground as $n's blade finds your artery!");
				sprintf(hit3, "Rivulets of blood run to the ground as $n's blade finds $N's artery!");
				sprintf(miss1, "You slash at $N's exposed artery but fail to connect.");
				sprintf(miss2, "$n slashes at your exposed artery but fails to connect.");
				sprintf(miss3, "$n slashes at $N's exposed artery but fails to connect.");

				dammod = 100;
				affect = ch->level / 4;
				break;
			case WEAPON_AXE:
				sprintf(hit1, "You slightly twist your axe as it sinks into $N's flesh, and a torrent of blood gushes forth!");
				sprintf(hit2, "$n slightly twists $s axe as it sinks into your flesh, and a torrent of blood gushes forth!");
				sprintf(hit3, "$n slightly twists $s axe as it sinks into $N's flesh, and a torrent of blood gushes forth!");
				sprintf(miss1, "You swing your axe in a wide arc but fail to connect with $N.");
				sprintf(miss2, "$n swings $s axe in a wide arc but fails to connect with you.");
				sprintf(miss3, "$n swings $s axe in a wide arc but fails to connect with $N.");

				dammod = 125;
				affect = ch->level / 4;
				break;
			case WEAPON_SPEAR:
				sprintf(hit1, "You drive your spear deep into $N's flesh, blood spilling forth as you withdraw it!");
				sprintf(hit2, "$n drives $s spear deep into your flesh, blood spilling forth as $e withdraws it!");
				sprintf(hit3, "$n drives $s spear deep into $N's flesh, blood spilling forth as $e withdraws it!");
				sprintf(miss1, "You lunge powerfully forward with your spear, but fail to connect.");
				sprintf(miss2, "$n lunges powerfully forward towards you with $s spear, but fails to connect.");
				sprintf(miss3, "$n lunges powerfully forward towards $N with $s spear, but fails to connect.");

				dammod = 200;
				affect = ch->level / 7;
				break;
			default:
				send_to_char("You cannot perform this attack with your weapon!\n\r", ch);
				return;
		}
	}
	else
	{
		send_to_char("You cannot execute that move barehanded!\n\r", ch);
		return;
	}

	if (number_percent() < .65 * skill)
	{

		act(hit1, ch, 0, victim, TO_CHAR);
		act(hit2, ch, 0, victim, TO_VICT);
		act(hit3, ch, 0, victim, TO_NOTVICT);

		if (!is_affected(victim, gsn_bleeding))
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = affect;
			af.type = gsn_bleeding;
			af.level = ch->level;
			af.location = APPLY_NONE;
			af.modifier = 0;
			af.aftype = AFT_MALADY;
			af.end_fun = nullptr;
			af.tick_fun = bleeding_tick;
			af.owner = ch;
			new_affect_to_char(victim, &af);
		}

		one_hit_new(ch, victim, gsn_bleed, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, dammod, nullptr);
		check_improve(ch, gsn_bleed, true, 1);
	}
	else
	{
		act(miss1, ch, 0, victim, TO_CHAR);
		act(miss2, ch, 0, victim, TO_VICT);
		act(miss3, ch, 0, victim, TO_NOTVICT);

		damage(ch, victim, 0, gsn_bleed, DAM_NONE, true);
		check_improve(ch, gsn_bleed, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}